

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

Belief * __thiscall despot::Pocman::InitialBelief(Pocman *this,State *start,string type)

{
  uint uVar1;
  State *pSVar2;
  PocmanBelief *this_00;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_89;
  double local_88;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_80;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  string local_50 [32];
  
  uVar1 = PocmanBelief::num_particles;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_80,
             (long)(int)PocmanBelief::num_particles,&local_89);
  local_88 = 1.0 / (double)(int)uVar1;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"DEFAULT",(allocator<char> *)&local_89);
    pSVar2 = (State *)(**(code **)(*(long *)this + 0x40))(this,local_50);
    local_80._M_impl.super__Vector_impl_data._M_start[uVar4] = pSVar2;
    std::__cxx11::string::~string(local_50);
    *(double *)(local_80._M_impl.super__Vector_impl_data._M_start[uVar4] + 0x18) = local_88;
  }
  this_00 = (PocmanBelief *)operator_new(0x98);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_68,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_80);
  PocmanBelief::PocmanBelief
            (this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_68,
             &this->super_DSPOMDP,(Belief *)0x0);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_68);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_80);
  return (Belief *)this_00;
}

Assistant:

Belief* Pocman::InitialBelief(const State* start, string type) const {
	int N = PocmanBelief::num_particles;
	vector<State*> particles(N);
	for (int i = 0; i < N; i++) {
		particles[i] = CreateStartState();
		particles[i]->weight = 1.0 / N;
	}

	return new PocmanBelief(particles, this);
}